

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O0

int vrna_E_ext_loop_5(vrna_fold_compound_t *fc)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  vrna_param_t *pvVar5;
  vrna_gr_aux_t *pvVar6;
  int iVar7;
  int iVar8;
  vrna_callback_hc_evaluate *evaluate_00;
  int local_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f4;
  vrna_gr_aux_t *grammar;
  sc_wrapper_f5 sc_wrapper;
  default_data hc_dat_local;
  vrna_callback_hc_evaluate *evaluate;
  vrna_param_t *P;
  int turn;
  int with_gquad;
  int dangle_model;
  int *f5;
  int local_20;
  int length;
  int j;
  int en;
  vrna_fold_compound_t *fc_local;
  
  if (fc == (vrna_fold_compound_t *)0x0) {
    fc_local._4_4_ = 10000000;
  }
  else {
    uVar1 = fc->length;
    piVar4 = (fc->matrices->field_2).field_0.f5;
    pvVar5 = fc->params;
    iVar8 = (pvVar5->model_details).dangles;
    iVar2 = (pvVar5->model_details).gquad;
    iVar3 = (pvVar5->model_details).min_loop_size;
    pvVar6 = fc->aux_grammar;
    evaluate_00 = prepare_hc_default(fc,(default_data *)&sc_wrapper.user_data_comparative);
    init_sc_wrapper(fc,(sc_wrapper_f5 *)&grammar);
    *piVar4 = 0;
    for (local_20 = 1; local_20 <= iVar3 + 1; local_20 = local_20 + 1) {
      iVar7 = reduce_f5_up(fc,local_20,evaluate_00,(default_data *)&sc_wrapper.user_data_comparative
                           ,(sc_wrapper_f5 *)&grammar);
      piVar4[local_20] = iVar7;
    }
    if ((pvVar6 != (vrna_gr_aux_t *)0x0) && (pvVar6->cb_aux_f != (vrna_callback_gr_rule *)0x0)) {
      for (local_20 = 1; local_20 <= iVar3 + 1; local_20 = local_20 + 1) {
        local_f4 = (*pvVar6->cb_aux_f)(fc,1,local_20,pvVar6->data);
        if (piVar4[local_20] < local_f4) {
          local_f4 = piVar4[local_20];
        }
        piVar4[local_20] = local_f4;
      }
    }
    if (iVar8 == 0) {
      for (local_20 = iVar3 + 2; local_20 <= (int)uVar1; local_20 = local_20 + 1) {
        iVar8 = reduce_f5_up(fc,local_20,evaluate_00,
                             (default_data *)&sc_wrapper.user_data_comparative,
                             (sc_wrapper_f5 *)&grammar);
        piVar4[local_20] = iVar8;
        local_108 = decompose_f5_ext_stem_d0
                              (fc,local_20,evaluate_00,
                               (default_data *)&sc_wrapper.user_data_comparative,
                               (sc_wrapper_f5 *)&grammar);
        if (piVar4[local_20] < local_108) {
          local_108 = piVar4[local_20];
        }
        piVar4[local_20] = local_108;
        if (iVar2 != 0) {
          local_10c = add_f5_gquad(fc,local_20,evaluate_00,
                                   (default_data *)&sc_wrapper.user_data_comparative,
                                   (sc_wrapper_f5 *)&grammar);
          if (piVar4[local_20] < local_10c) {
            local_10c = piVar4[local_20];
          }
          piVar4[local_20] = local_10c;
        }
        if ((pvVar6 != (vrna_gr_aux_t *)0x0) && (pvVar6->cb_aux_f != (vrna_callback_gr_rule *)0x0))
        {
          local_110 = (*pvVar6->cb_aux_f)(fc,1,local_20,pvVar6->data);
          if (piVar4[local_20] < local_110) {
            local_110 = piVar4[local_20];
          }
          piVar4[local_20] = local_110;
        }
      }
    }
    else if (iVar8 == 2) {
      for (local_20 = iVar3 + 2; local_20 <= (int)uVar1; local_20 = local_20 + 1) {
        iVar8 = reduce_f5_up(fc,local_20,evaluate_00,
                             (default_data *)&sc_wrapper.user_data_comparative,
                             (sc_wrapper_f5 *)&grammar);
        piVar4[local_20] = iVar8;
        local_fc = decompose_f5_ext_stem_d2
                             (fc,local_20,evaluate_00,
                              (default_data *)&sc_wrapper.user_data_comparative,
                              (sc_wrapper_f5 *)&grammar);
        if (piVar4[local_20] < local_fc) {
          local_fc = piVar4[local_20];
        }
        piVar4[local_20] = local_fc;
        if (iVar2 != 0) {
          local_100 = add_f5_gquad(fc,local_20,evaluate_00,
                                   (default_data *)&sc_wrapper.user_data_comparative,
                                   (sc_wrapper_f5 *)&grammar);
          if (piVar4[local_20] < local_100) {
            local_100 = piVar4[local_20];
          }
          piVar4[local_20] = local_100;
        }
        if ((pvVar6 != (vrna_gr_aux_t *)0x0) && (pvVar6->cb_aux_f != (vrna_callback_gr_rule *)0x0))
        {
          local_104 = (*pvVar6->cb_aux_f)(fc,1,local_20,pvVar6->data);
          if (piVar4[local_20] < local_104) {
            local_104 = piVar4[local_20];
          }
          piVar4[local_20] = local_104;
        }
      }
    }
    else {
      for (local_20 = iVar3 + 2; local_20 <= (int)uVar1; local_20 = local_20 + 1) {
        iVar8 = reduce_f5_up(fc,local_20,evaluate_00,
                             (default_data *)&sc_wrapper.user_data_comparative,
                             (sc_wrapper_f5 *)&grammar);
        piVar4[local_20] = iVar8;
        local_114 = decompose_f5_ext_stem_d1
                              (fc,local_20,evaluate_00,
                               (default_data *)&sc_wrapper.user_data_comparative,
                               (sc_wrapper_f5 *)&grammar);
        if (piVar4[local_20] < local_114) {
          local_114 = piVar4[local_20];
        }
        piVar4[local_20] = local_114;
        if (iVar2 != 0) {
          local_118 = add_f5_gquad(fc,local_20,evaluate_00,
                                   (default_data *)&sc_wrapper.user_data_comparative,
                                   (sc_wrapper_f5 *)&grammar);
          if (piVar4[local_20] < local_118) {
            local_118 = piVar4[local_20];
          }
          piVar4[local_20] = local_118;
        }
        if ((pvVar6 != (vrna_gr_aux_t *)0x0) && (pvVar6->cb_aux_f != (vrna_callback_gr_rule *)0x0))
        {
          local_11c = (*pvVar6->cb_aux_f)(fc,1,local_20,pvVar6->data);
          if (piVar4[local_20] < local_11c) {
            local_11c = piVar4[local_20];
          }
          piVar4[local_20] = local_11c;
        }
      }
    }
    free_sc_wrapper((sc_wrapper_f5 *)&grammar);
    fc_local._4_4_ = piVar4[(int)uVar1];
  }
  return fc_local._4_4_;
}

Assistant:

PUBLIC int
vrna_E_ext_loop_5(vrna_fold_compound_t *fc)
{
  if (fc) {
    int                       en, j, length, *f5, dangle_model, with_gquad, turn;
    vrna_param_t              *P;
    vrna_callback_hc_evaluate *evaluate;
    struct default_data       hc_dat_local;
    struct sc_wrapper_f5      sc_wrapper;
    vrna_gr_aux_t             *grammar;

    length        = (int)fc->length;
    f5            = fc->matrices->f5;
    P             = fc->params;
    dangle_model  = P->model_details.dangles;
    with_gquad    = P->model_details.gquad;
    turn          = P->model_details.min_loop_size;
    grammar       = fc->aux_grammar;
    evaluate      = prepare_hc_default(fc, &hc_dat_local);

    init_sc_wrapper(fc, &sc_wrapper);

    f5[0] = 0;
    for (j = 1; j <= turn + 1; j++)
      f5[j] = reduce_f5_up(fc, j, evaluate, &hc_dat_local, &sc_wrapper);

    if ((grammar) && (grammar->cb_aux_f)) {
      for (j = 1; j <= turn + 1; j++) {
        en    = grammar->cb_aux_f(fc, 1, j, grammar->data);
        f5[j] = MIN2(f5[j], en);
      }
    }

    /*
     *  duplicated code may be faster than conditions inside loop or even
     *  using a function pointer ;)
     */
    switch (dangle_model) {
      case 2:
        for (j = turn + 2; j <= length; j++) {
          /* extend previous solution(s) by adding an unpaired region */
          f5[j] = reduce_f5_up(fc, j, evaluate, &hc_dat_local, &sc_wrapper);

          /* decompose into exterior loop part followed by a stem */
          en    = decompose_f5_ext_stem_d2(fc, j, evaluate, &hc_dat_local, &sc_wrapper);
          f5[j] = MIN2(f5[j], en);

          if (with_gquad) {
            en    = add_f5_gquad(fc, j, evaluate, &hc_dat_local, &sc_wrapper);
            f5[j] = MIN2(f5[j], en);
          }

          if ((grammar) && (grammar->cb_aux_f)) {
            en    = grammar->cb_aux_f(fc, 1, j, grammar->data);
            f5[j] = MIN2(f5[j], en);
          }
        }
        break;

      case 0:
        for (j = turn + 2; j <= length; j++) {
          /* extend previous solution(s) by adding an unpaired region */
          f5[j] = reduce_f5_up(fc, j, evaluate, &hc_dat_local, &sc_wrapper);

          /* decompose into exterior loop part followed by a stem */
          en    = decompose_f5_ext_stem_d0(fc, j, evaluate, &hc_dat_local, &sc_wrapper);
          f5[j] = MIN2(f5[j], en);

          if (with_gquad) {
            en    = add_f5_gquad(fc, j, evaluate, &hc_dat_local, &sc_wrapper);
            f5[j] = MIN2(f5[j], en);
          }

          if ((grammar) && (grammar->cb_aux_f)) {
            en    = grammar->cb_aux_f(fc, 1, j, grammar->data);
            f5[j] = MIN2(f5[j], en);
          }
        }
        break;

      default:
        for (j = turn + 2; j <= length; j++) {
          /* extend previous solution(s) by adding an unpaired region */
          f5[j] = reduce_f5_up(fc, j, evaluate, &hc_dat_local, &sc_wrapper);

          en    = decompose_f5_ext_stem_d1(fc, j, evaluate, &hc_dat_local, &sc_wrapper);
          f5[j] = MIN2(f5[j], en);

          if (with_gquad) {
            en    = add_f5_gquad(fc, j, evaluate, &hc_dat_local, &sc_wrapper);
            f5[j] = MIN2(f5[j], en);
          }

          if ((grammar) && (grammar->cb_aux_f)) {
            en    = grammar->cb_aux_f(fc, 1, j, grammar->data);
            f5[j] = MIN2(f5[j], en);
          }
        }
        break;
    }

    free_sc_wrapper(&sc_wrapper);

    return f5[length];
  }

  return INF;
}